

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::
int_writer<__int128,_fmt::v6::basic_format_specs<char>_>::on_dec
          (int_writer<__int128,_fmt::v6::basic_format_specs<char>_> *this)

{
  undefined1 n [16];
  format_specs specs;
  int iVar1;
  undefined8 in_RDI;
  undefined8 unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  dec_writer in_stack_00000020;
  int num_digits;
  undefined8 in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  n._8_8_ = in_stack_ffffffffffffff68;
  n._0_8_ = in_stack_ffffffffffffff60;
  iVar1 = count_digits((uint128_t)n);
  get_prefix((int_writer<__int128,_fmt::v6::basic_format_specs<char>_> *)0x14551d);
  specs._8_8_ = unaff_retaddr;
  specs.width = (int)in_RDI;
  specs.precision = (int)((ulong)in_RDI >> 0x20);
  basic_writer<fmt::v6::buffer_range<char>>::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<__int128,fmt::v6::basic_format_specs<char>>::dec_writer>
            ((basic_writer<fmt::v6::buffer_range<char>_> *)CONCAT44(iVar1,in_stack_fffffffffffffff0)
             ,in_stack_ffffffffffffffec,(string_view)in_stack_00000008,specs,in_stack_00000020);
  return;
}

Assistant:

void on_dec() {
      int num_digits = count_digits(abs_value);
      writer.write_int(num_digits, get_prefix(), specs,
                       dec_writer{abs_value, num_digits});
    }